

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O0

void __thiscall ManyDoublesWriteTest::RunShard(ManyDoublesWriteTest *this,int shard)

{
  bool bVar1;
  char *message;
  double value;
  AssertHelper local_c8;
  Message local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  uint64_t them_bits;
  double them_double;
  char *endptr;
  uint64_t bits;
  int top_byte;
  int last_top_byte;
  uint32_t halfbits;
  uint32_t last_bits;
  char buffer [100];
  int shard_local;
  ManyDoublesWriteTest *this_local;
  
  last_top_byte = 0;
  bits._4_4_ = 0xffffffff;
  top_byte = shard;
  buffer._92_4_ = shard;
  unique0x1000021f = this;
  do {
    if ((uint)top_byte < (uint)last_top_byte) {
      if (buffer._92_4_ == 0) {
        printf("done.\n");
        fflush(_stdout);
      }
      return;
    }
    if ((buffer._92_4_ == 0) && (bits._0_4_ = (uint)top_byte >> 0x18, (uint)bits != bits._4_4_)) {
      printf("value: 0x%08x (%d%%)\r",(ulong)(uint)top_byte,
             (ulong)(uint)(int)(((double)(uint)top_byte * 100.0) / 4294967295.0));
      fflush(_stdout);
      bits._4_4_ = (uint)bits;
    }
    endptr = (char *)CONCAT44(top_byte,top_byte);
    bVar1 = is_infinity_or_nan((uint64_t)endptr);
    if (!bVar1) {
      wabt::WriteDoubleHex((char *)&halfbits,100,(uint64_t)endptr);
      value = strtod((char *)&halfbits,(char **)&them_double);
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           bit_cast<unsigned_long,double>(value);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_b8,"bits","them_bits",(unsigned_long *)&endptr,
                 (unsigned_long *)&gtest_ar.message_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
      if (!bVar1) {
        testing::Message::Message(&local_c0);
        message = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-hexfloat.cc"
                   ,0xdd,message);
        testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        testing::Message::~Message(&local_c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
      if (!bVar1) {
        return;
      }
    }
    last_top_byte = top_byte;
    top_byte = (this->super_ThreadedTest).num_threads_ + top_byte;
  } while( true );
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(halfbits) {
      LOG_COMPLETION(halfbits);
      uint64_t bits = (static_cast<uint64_t>(halfbits) << 32) | halfbits;
      if (is_infinity_or_nan(bits))
        continue;

      WriteDoubleHex(buffer, sizeof(buffer), bits);

      char* endptr;
      double them_double = strtod(buffer, &endptr);
      uint64_t them_bits = bit_cast<uint64_t>(them_double);
      ASSERT_EQ(bits, them_bits);
    }
    LOG_DONE();
  }